

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O3

CordzInfo * __thiscall
absl::lts_20250127::cord_internal::CordzInfo::Next(CordzInfo *this,CordzSnapshot *snapshot)

{
  CordzInfo *handle;
  bool bVar1;
  CordzInfo *pCVar2;
  CordzInfo *extraout_RAX;
  int64_t sampling_stride;
  MethodIdentifier method;
  
  if (snapshot[8] == (CordzSnapshot)0x0) {
    Next();
    method = (MethodIdentifier)snapshot;
    pCVar2 = this;
  }
  else {
    handle = (this->ci_next_)._M_b._M_p;
    pCVar2 = (CordzInfo *)snapshot;
    bVar1 = CordzHandle::DiagnosticsHandleIsSafeToInspect
                      ((CordzHandle *)snapshot,&this->super_CordzHandle);
    method = (MethodIdentifier)this;
    if (bVar1) {
      pCVar2 = handle;
      bVar1 = CordzHandle::DiagnosticsHandleIsSafeToInspect
                        ((CordzHandle *)snapshot,&handle->super_CordzHandle);
      method = (MethodIdentifier)pCVar2;
      if (bVar1) {
        return handle;
      }
      goto LAB_00369e2a;
    }
  }
  snapshot = (CordzSnapshot *)pCVar2;
  Next();
LAB_00369e2a:
  Next();
  if (((ulong)(((CordzInfo *)snapshot)->super_CordzHandle)._vptr_CordzHandle & 1) == 0) {
    __assert_fail("cord.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                  ,0xfe,
                  "static void absl::cord_internal::CordzInfo::TrackCord(InlineData &, MethodIdentifier, int64_t)"
                 );
  }
  if ((((CordzInfo *)snapshot)->super_CordzHandle)._vptr_CordzHandle == (_func_int **)0x1) {
    pCVar2 = (CordzInfo *)operator_new(0x540);
    CordzInfo(pCVar2,*(CordRep **)&(((CordzInfo *)snapshot)->super_CordzHandle).is_snapshot_,
              (CordzInfo *)0x0,method,sampling_stride);
    if (((ulong)(((CordzInfo *)snapshot)->super_CordzHandle)._vptr_CordzHandle & 1) != 0) {
      (((CordzInfo *)snapshot)->super_CordzHandle)._vptr_CordzHandle =
           (_func_int **)((ulong)pCVar2 | 1);
      Track(pCVar2);
      return extraout_RAX;
    }
    __assert_fail("is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x24d,"void absl::cord_internal::InlineData::set_cordz_info(CordzInfo *)");
  }
  __assert_fail("!cord.is_profiled()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                ,0xff,
                "static void absl::cord_internal::CordzInfo::TrackCord(InlineData &, MethodIdentifier, int64_t)"
               );
}

Assistant:

CordzInfo* CordzInfo::Next(const CordzSnapshot& snapshot) const {
  ABSL_ASSERT(snapshot.is_snapshot());

  // Similar to the 'Head()' function, we do not need a mutex here.
  CordzInfo* next = ci_next_.load(std::memory_order_acquire);
  ABSL_ASSERT(snapshot.DiagnosticsHandleIsSafeToInspect(this));
  ABSL_ASSERT(snapshot.DiagnosticsHandleIsSafeToInspect(next));
  return next;
}